

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

ssize_t Curl_bufq_write_pass
                  (bufq *q,uchar *buf,size_t len,Curl_bufq_writer *writer,void *writer_ctx,
                  CURLcode *err)

{
  buf_chunk *pbVar1;
  CURLcode CVar2;
  ssize_t sVar3;
  ulong uVar4;
  
  *err = CURLE_OK;
  if (len == 0) {
    CVar2 = CURLE_OK;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      pbVar1 = q->tail;
      if ((pbVar1 != (buf_chunk *)0x0) && (q->spare == (buf_chunk *)0x0)) {
        if ((q->chunk_count < q->max_chunks) ||
           (((q->chunk_count <= q->max_chunks && (pbVar1->w_offset < pbVar1->dlen)) ||
            (sVar3 = Curl_bufq_pass(q,writer,writer_ctx,err), -1 < sVar3)))) goto LAB_0071f17c;
LAB_0071f1aa:
        if (*err != CURLE_AGAIN) {
          return -1;
        }
LAB_0071f1b6:
        CVar2 = CURLE_AGAIN;
        if (uVar4 != 0) {
          CVar2 = CURLE_OK;
        }
        uVar4 = uVar4 | -(ulong)(uVar4 == 0);
        goto LAB_0071f1cd;
      }
LAB_0071f17c:
      sVar3 = Curl_bufq_write(q,buf,len,err);
      if (sVar3 < 0) goto LAB_0071f1aa;
      if (sVar3 == 0) goto LAB_0071f1b6;
      buf = buf + sVar3;
      uVar4 = uVar4 + sVar3;
      len = len - sVar3;
    } while (len != 0);
    CVar2 = CURLE_OK;
  }
LAB_0071f1cd:
  *err = CVar2;
  return uVar4;
}

Assistant:

ssize_t Curl_bufq_write_pass(struct bufq *q,
                             const unsigned char *buf, size_t len,
                             Curl_bufq_writer *writer, void *writer_ctx,
                             CURLcode *err)
{
  ssize_t nwritten = 0, n;

  *err = CURLE_OK;
  while(len) {
    if(Curl_bufq_is_full(q)) {
      /* try to make room in case we are full */
      n = Curl_bufq_pass(q, writer, writer_ctx, err);
      if(n < 0) {
        if(*err != CURLE_AGAIN) {
          /* real error, fail */
          return -1;
        }
        /* would block, bufq is full, give up */
        break;
      }
    }

    /* Add whatever is remaining now to bufq */
    n = Curl_bufq_write(q, buf, len, err);
    if(n < 0) {
      if(*err != CURLE_AGAIN) {
        /* real error, fail */
        return -1;
      }
      /* no room in bufq */
      break;
    }
    /* edge case of writer returning 0 (and len is >0)
     * break or we might enter an infinite loop here */
    if(n == 0)
      break;

    /* Maybe only part of `data` has been added, continue to loop */
    buf += (size_t)n;
    len -= (size_t)n;
    nwritten += (size_t)n;
  }

  if(!nwritten && len) {
    *err = CURLE_AGAIN;
    return -1;
  }
  *err = CURLE_OK;
  return nwritten;
}